

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

code_point nowide::utf::utf_traits<char,1>::decode<char_const*>(char **p,char *e)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint local_2c;
  char cStack_28;
  uchar tmp;
  code_point c;
  int trail_size;
  uchar lead;
  char *e_local;
  char **p_local;
  
  if (*p == e) {
    return 0xfffffffe;
  }
  pbVar2 = (byte *)*p;
  *p = (char *)(pbVar2 + 1);
  bVar1 = *pbVar2;
  iVar4 = utf_traits<char,_1>::trail_length(bVar1);
  if (iVar4 < 0) {
    return 0xffffffff;
  }
  if (iVar4 == 0) {
    return (uint)bVar1;
  }
  cStack_28 = (char)iVar4;
  local_2c = (uint)bVar1 & (1 << (6U - cStack_28 & 0x1f)) - 1U;
  if (iVar4 != 1) {
    if (iVar4 != 2) {
      if (iVar4 != 3) goto LAB_0010921b;
      if (*p == e) {
        return 0xfffffffe;
      }
      pbVar2 = (byte *)*p;
      *p = (char *)(pbVar2 + 1);
      bVar1 = *pbVar2;
      bVar3 = utf_traits<char,_1>::is_trail(bVar1);
      if (!bVar3) {
        return 0xffffffff;
      }
      local_2c = local_2c << 6 | bVar1 & 0x3f;
    }
    if (*p == e) {
      return 0xfffffffe;
    }
    pbVar2 = (byte *)*p;
    *p = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    bVar3 = utf_traits<char,_1>::is_trail(bVar1);
    if (!bVar3) {
      return 0xffffffff;
    }
    local_2c = local_2c << 6 | bVar1 & 0x3f;
  }
  if (*p == e) {
    return 0xfffffffe;
  }
  pbVar2 = (byte *)*p;
  *p = (char *)(pbVar2 + 1);
  bVar1 = *pbVar2;
  bVar3 = utf_traits<char,_1>::is_trail(bVar1);
  if (!bVar3) {
    return 0xffffffff;
  }
  local_2c = local_2c << 6 | bVar1 & 0x3f;
LAB_0010921b:
  bVar3 = is_valid_codepoint(local_2c);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    iVar5 = utf_traits<char,_1>::width(local_2c);
    if (iVar5 == iVar4 + 1) {
      p_local._4_4_ = local_2c;
    }
    else {
      p_local._4_4_ = 0xffffffff;
    }
  }
  else {
    p_local._4_4_ = 0xffffffff;
  }
  return p_local._4_4_;
}

Assistant:

static code_point decode(Iterator &p,Iterator e)
        {
            if(NOWIDE_UNLIKELY(p==e))
                return incomplete;

            unsigned char lead = *p++;

            // First byte is fully validated here
            int trail_size = trail_length(lead);

            if(NOWIDE_UNLIKELY(trail_size < 0))
                return illegal;

            //
            // Ok as only ASCII may be of size = 0
            // also optimize for ASCII text
            //
            if(trail_size == 0)
                return lead;
            
            code_point c = lead & ((1<<(6-trail_size))-1);

            // Read the rest
            unsigned char tmp;
            switch(trail_size) {
            case 3:
                if(NOWIDE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            case 2:
                if(NOWIDE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            case 1:
                if(NOWIDE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            }

            // Check code point validity: no surrogates and
            // valid range
            if(NOWIDE_UNLIKELY(!is_valid_codepoint(c)))
                return illegal;

            // make sure it is the most compact representation
            if(NOWIDE_UNLIKELY(width(c)!=trail_size + 1))
                return illegal;

            return c;

        }